

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

ChQuaternion<double> * __thiscall
chrono::ChQuaternion<double>::operator=(ChQuaternion<double> *this,ChQuaternion<double> *other)

{
  if (other != this) {
    this->m_data[0] = other->m_data[0];
    this->m_data[1] = other->m_data[1];
    this->m_data[2] = other->m_data[2];
    this->m_data[3] = other->m_data[3];
  }
  return this;
}

Assistant:

inline ChQuaternion<Real>& ChQuaternion<Real>::operator=(const ChQuaternion<Real>& other) {
    if (&other == this)
        return *this;
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
    m_data[3] = other.m_data[3];
    return *this;
}